

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_attribute_struct *a,
          xml_node_struct *parent,xpath_allocator *alloc)

{
  bool bVar1;
  xml_node_struct *in_RCX;
  xpath_node_set_raw *this_00;
  xml_attribute_struct *in_RDX;
  xpath_allocator *in_RSI;
  long in_RDI;
  char_t *name;
  char_t *in_stack_ffffffffffffff38;
  xpath_allocator *in_stack_ffffffffffffff40;
  xpath_node *in_stack_ffffffffffffff48;
  char *local_a8;
  xml_node local_98;
  xml_attribute local_90 [3];
  xml_node local_78;
  xml_attribute local_70 [3];
  xml_node local_58;
  xml_attribute local_50 [3];
  char_t *local_38;
  xml_node_struct *local_28;
  xml_attribute_struct *local_20;
  xpath_allocator *local_18;
  
  if (in_RDX->name == (char_t *)0x0) {
    local_a8 = "";
  }
  else {
    local_a8 = in_RDX->name;
  }
  local_38 = local_a8;
  this_00 = (xpath_node_set_raw *)(ulong)((int)*(char *)(in_RDI + 3) - 1);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  switch(this_00) {
  case (xpath_node_set_raw *)0x0:
    bVar1 = strequal((char_t *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if ((bVar1) && (bVar1 = is_xpath_attribute((char_t *)in_stack_ffffffffffffff40), bVar1)) {
      xml_attribute::xml_attribute(local_50,local_20);
      xml_node::xml_node(&local_58,local_28);
      xpath_node::xpath_node
                ((xpath_node *)this_00,(xml_attribute *)local_18,
                 (xml_node *)in_stack_ffffffffffffff40);
      xpath_node_set_raw::push_back(this_00,(xpath_node *)local_18,in_stack_ffffffffffffff40);
      return true;
    }
    break;
  case (xpath_node_set_raw *)0x1:
  case (xpath_node_set_raw *)0x6:
    bVar1 = is_xpath_attribute((char_t *)in_stack_ffffffffffffff40);
    if (bVar1) {
      xml_attribute::xml_attribute(local_70,local_20);
      xml_node::xml_node(&local_78,local_28);
      xpath_node::xpath_node
                ((xpath_node *)this_00,(xml_attribute *)in_stack_ffffffffffffff48,
                 (xml_node *)local_18);
      xpath_node_set_raw::push_back(this_00,in_stack_ffffffffffffff48,local_18);
      return true;
    }
    break;
  default:
    break;
  case (xpath_node_set_raw *)0x7:
    bVar1 = starts_with(local_a8,*(char_t **)(in_RDI + 0x20));
    if ((bVar1) && (bVar1 = is_xpath_attribute((char_t *)in_stack_ffffffffffffff40), bVar1)) {
      xml_attribute::xml_attribute(local_90,local_20);
      xml_node::xml_node(&local_98,local_28);
      xpath_node::xpath_node
                ((xpath_node *)this_00,(xml_attribute *)in_stack_ffffffffffffff48,
                 (xml_node *)in_stack_ffffffffffffff40);
      xpath_node_set_raw::push_back(this_00,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      return true;
    }
  }
  return false;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_attribute_struct* a, xml_node_struct* parent, xpath_allocator* alloc)
		{
			assert(a);

			const char_t* name = a->name ? a->name + 0 : PUGIXML_TEXT("");

			switch (_test)
			{
			case nodetest_name:
				if (strequal(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
			case nodetest_all:
				if (is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (starts_with(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			default:
				;
			}

			return false;
		}